

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.h
# Opt level: O1

ostream * libDAI::operator<<(ostream *os,Bucket *b)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  pointer pBVar4;
  char *pcVar5;
  ulong uVar6;
  pointer pVVar7;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Bucket[var = ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"; factors = {",0xd);
  pBVar4 = (b->super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>).
           super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((b->super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>).
      super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish != pBVar4) {
    uVar6 = 0;
    lVar2 = 0;
    do {
      lVar3 = lVar2;
      if (pBVar4[uVar6].isFactor == true) {
        lVar3 = lVar2 + 1;
        pcVar5 = "";
        if (lVar2 != 0) {
          pcVar5 = ",";
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,(ulong)(lVar2 != 0));
        pBVar4 = (b->
                 super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                 ).
                 super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar7 = *(pointer *)&pBVar4[uVar6].super_VarSet._vars;
        if (pVVar7 != *(pointer *)((long)&pBVar4[uVar6].super_VarSet._vars + 8)) {
          do {
            operator<<(os,pVVar7);
            pVVar7 = pVVar7 + 1;
          } while (pVVar7 != *(pointer *)((long)&pBVar4[uVar6].super_VarSet._vars + 8));
        }
      }
      uVar6 = uVar6 + 1;
      pBVar4 = (b->
               super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>).
               super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar3;
    } while (uVar6 < (ulong)(((long)(b->
                                    super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                                    ).
                                    super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar4 >> 4)
                            * -0x5555555555555555));
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"}; messages = {",0xf);
  pBVar4 = (b->super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>).
           super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((b->super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>).
      super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish != pBVar4) {
    uVar6 = 0;
    lVar2 = 0;
    do {
      lVar3 = lVar2;
      if (pBVar4[uVar6].isFactor == false) {
        lVar3 = lVar2 + 1;
        pcVar5 = "";
        if (lVar2 != 0) {
          pcVar5 = ",";
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,(ulong)(lVar2 != 0));
        pBVar4 = (b->
                 super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                 ).
                 super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar7 = *(pointer *)&pBVar4[uVar6].super_VarSet._vars;
        if (pVVar7 != *(pointer *)((long)&pBVar4[uVar6].super_VarSet._vars + 8)) {
          do {
            operator<<(os,pVVar7);
            pVVar7 = pVVar7 + 1;
          } while (pVVar7 != *(pointer *)((long)&pBVar4[uVar6].super_VarSet._vars + 8));
        }
      }
      uVar6 = uVar6 + 1;
      pBVar4 = (b->
               super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>).
               super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar3;
    } while (uVar6 < (ulong)(((long)(b->
                                    super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                                    ).
                                    super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar4 >> 4)
                            * -0x5555555555555555));
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"}]",2);
  return os;
}

Assistant:

std::ostream & operator << ( std::ostream & os, const Bucket & b ) {
                        os << "Bucket[var = " << b.var << "; factors = {";
                        size_t count = 0;
                        for( size_t bE = 0; bE < b.size(); bE++ )
                            if( b[bE].isFactor )
                                os << ((count++) ? "," : "") << b[bE];
                        os << "}; messages = {";
                        count = 0;
                        for( size_t bE = 0; bE < b.size(); bE++ )
                            if( !b[bE].isFactor )
                                os << ((count++) ? "," : "") << b[bE];
                        os << "}]";

                        return(os);
                    }